

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool cs_impl::file_system::mkdir_p(string *path)

{
  char cVar1;
  bool bVar2;
  bool absolute_path;
  bool absolute_path_00;
  allocator_type local_55;
  key_equal local_54;
  hasher local_53;
  char local_52 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
  local_38;
  
  if ((path->_M_string_length == 0) ||
     ((cVar1 = *(path->_M_dataplus)._M_p, cVar1 != '\\' && (cVar1 != '/')))) {
    local_52[0] = '/';
    local_52[1] = '\\';
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<char>>
    ::raw_hash_set<char_const*>
              ((raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<char>>
                *)&local_38,local_52,(char *)&local_50,0,&local_53,&local_54,&local_55);
    cs_system_impl::split(&local_50,path,(set_t<char> *)&local_38);
    bVar2 = cs_system_impl::mkdir_dirs(&local_50,0,absolute_path_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
    ::destroy_slots(&local_38);
  }
  else {
    local_52[0] = '/';
    local_52[1] = '\\';
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<char>>
    ::raw_hash_set<char_const*>
              ((raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<char>>
                *)&local_38,local_52,(char *)&local_50,0,&local_53,&local_54,&local_55);
    cs_system_impl::split(&local_50,path,(set_t<char> *)&local_38);
    bVar2 = cs_system_impl::mkdir_dirs(&local_50,1,absolute_path);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
    ::destroy_slots(&local_38);
  }
  return bVar2;
}

Assistant:

bool mkdir_p(const std::string &path)
		{
			if (path.size() > 0 && (path[0] == '/' || path[0] == '\\'))
				return cs_system_impl::mkdir_dirs(cs_system_impl::split(path, {'/', '\\'}), 0755, true);
			else
				return cs_system_impl::mkdir_dirs(cs_system_impl::split(path, {'/', '\\'}), 0755, false);
		}